

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::DefineTextureFromImage::exec(DefineTextureFromImage *this,Thread *t)

{
  ostream *poVar1;
  deUint32 dVar2;
  Thread *pTVar3;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 != (Thread *)0x0) {
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glBindTexture(GL_TEXTURE_2D, ",0x26);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0xb8))
              (0xde1,((this->m_texture).m_ptr)->texture);
    dVar2 = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, m_texture->texture)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,2000);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x18),"End -- glBindTexture()",0x16);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    poVar1 = (ostream *)(local_1b0 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Begin -- glEGLImageTargetTexture2DOES(GL_TEXTURE_2D, ",0x35);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    (**(code **)(*(long *)&pTVar3[1].m_random.m_rnd + 0x58))(0xde1,((this->m_image).m_ptr)->image);
    dVar2 = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"glEGLImageTargetTexture2DOES()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x7d5);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x18),"End -- glEGLImageTargetTexture2DOES()",0x25);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x18),"Begin -- glBindTexture(GL_TEXTURE_2D, 0)",0x28);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0xb8))(0xde1,0);
    dVar2 = (**(code **)(*(long *)&pTVar3[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindTexture(GL_TEXTURE_2D, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x7d9);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 0x18),"End -- glBindTexture()",0x16);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_128);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DefineTextureFromImage::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, " << m_texture->texture << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, m_texture->texture));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glEGLImageTargetTexture2DOES(GL_TEXTURE_2D, " << m_image->image << ")" << tcu::ThreadUtil::Message::End;
	thread.runtimeContext->glExtensions.imageTargetTexture2D(GL_TEXTURE_2D, m_image->image);
	GLU_CHECK_GLW_MSG(thread.gl, "glEGLImageTargetTexture2DOES()");
	thread.newMessage() << "End -- glEGLImageTargetTexture2DOES()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindTexture(GL_TEXTURE_2D, 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindTexture(GL_TEXTURE_2D, 0));
	thread.newMessage() << "End -- glBindTexture()" << tcu::ThreadUtil::Message::End;
}